

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpgen.cpp
# Opt level: O2

void __thiscall
cp::cpgen::calcNextFootprint
          (cpgen *this,Vector3 *step_vector,double step_angle,Pose *ref_waist_pose,
          Pose *ref_land_pose)

{
  Quat *_a;
  Quat ref_land_pose_q;
  Vector3 ref_land_pose_p;
  Quat waist_r;
  Vector3 waist_pos;
  Quat local_c8;
  Vector3 local_a0;
  Quat local_88;
  Vector3 local_60;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_48 [16];
  undefined8 local_38;
  
  _a = &ref_waist_pose->qq;
  rpy2q(&local_c8,0.0,0.0,step_angle);
  Eigen::internal::
  quat_product<1,_Eigen::Quaternion<double,_0>,_Eigen::Quaternion<double,_0>,_double>::run
            ((QuaternionBase<Eigen::Quaternion<double,_0>_> *)_a,
             (QuaternionBase<Eigen::Quaternion<double,_0>_> *)&local_c8);
  Eigen::QuaternionBase<Eigen::Quaternion<double,_0>_>::_transformVector
            (&local_a0,(QuaternionBase<Eigen::Quaternion<double,_0>_> *)&local_88,step_vector);
  local_c8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array[0] = (double)ref_waist_pose;
  local_c8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array[1] = (double)&local_a0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (local_48,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       *)&local_c8);
  local_38 = 0;
  Pose::set(ref_waist_pose,(Vector3 *)local_48,&local_88);
  Eigen::QuaternionBase<Eigen::Quaternion<double,_0>_>::_transformVector
            (&local_60,(QuaternionBase<Eigen::Quaternion<double,_0>_> *)_a,
             (Vector3 *)(this + (ulong)*(uint *)(this + 0x8d8) * 0x18 + 0x8f0));
  local_c8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array[0] = (double)ref_waist_pose;
  local_c8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array[1] = (double)&local_60;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_a0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_c8);
  Eigen::internal::
  quat_product<1,_Eigen::Quaternion<double,_0>,_Eigen::Quaternion<double,_0>,_double>::run
            ((QuaternionBase<Eigen::Quaternion<double,_0>_> *)_a,
             (QuaternionBase<Eigen::Quaternion<double,_0>_> *)(this + 0x940));
  Pose::set(ref_land_pose + *(uint *)(this + 0x8d8),(Vector3 *)&local_a0,&local_c8);
  return;
}

Assistant:

void cpgen::calcNextFootprint(const Vector3& step_vector, double step_angle,
    Pose& ref_waist_pose, Pose ref_land_pose[]) {

  // calc next waist pose
  Quat waist_r = ref_waist_pose.q() * rpy2q(0.0, 0.0, step_angle);
  Vector3 waist_pos = ref_waist_pose.p() + waist_r * step_vector;
  waist_pos.z() = 0.0;
  ref_waist_pose.set(waist_pos, waist_r);

  // calc footprints
  Vector3 ref_land_pose_p = ref_waist_pose.p() +
                            ref_waist_pose.q() * dist_body2foot[swingleg];
  Quat ref_land_pose_q    = ref_waist_pose.q() * init_feet_pose[0].q();
  ref_land_pose[swingleg].set(ref_land_pose_p, ref_land_pose_q);
}